

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.h
# Opt level: O0

Camera __thiscall pbrt::BasicScene::GetCamera(BasicScene *this)

{
  bool bVar1;
  long in_RSI;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  in_RDI;
  optional<pbrt::Camera> c;
  char *in_stack_000000a8;
  int in_stack_000000b4;
  char *in_stack_000000b8;
  LogLevel in_stack_000000c4;
  Camera *in_stack_ffffffffffffff98;
  mutex *in_stack_ffffffffffffffa0;
  mutex *in_stack_ffffffffffffffd0;
  AsyncJob<pbrt::Camera> *in_stack_ffffffffffffffd8;
  optional local_20 [32];
  
  std::mutex::lock(in_stack_ffffffffffffffa0);
  while (bVar1 = pbrt::TaggedPointer::operator_cast_to_bool((TaggedPointer *)(in_RSI + 0x218)),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    AsyncJob<pbrt::Camera>::TryGetResult(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    bVar1 = pstd::optional::operator_cast_to_bool(local_20);
    if (bVar1) {
      in_stack_ffffffffffffffa0 =
           (mutex *)pstd::optional<pbrt::Camera>::operator*((optional<pbrt::Camera> *)0x540c63);
      Camera::operator=((Camera *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
    pstd::optional<pbrt::Camera>::~optional((optional<pbrt::Camera> *)0x540ca8);
  }
  std::mutex::unlock((mutex *)0x540cbe);
  if (logging::logLevel < 1) {
    Log(in_stack_000000c4,in_stack_000000b8,in_stack_000000b4,in_stack_000000a8);
  }
  Camera::Camera((Camera *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  return (Camera)(TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
                  )in_RDI.bits;
}

Assistant:

Camera GetCamera() {
        cameraJobMutex.lock();
        while (!camera) {
            pstd::optional<Camera> c = cameraJob->TryGetResult(&cameraJobMutex);
            if (c)
                camera = *c;
        }
        cameraJobMutex.unlock();
        LOG_VERBOSE("Retrieved Camera from future");
        return camera;
    }